

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskamain.c
# Opt level: O0

err_t MATROSKA_BlockGetFrame
                (matroska_block *Block,size_t FrameNum,matroska_frame *Frame,bool_t WithData)

{
  mkv_timestamp_t mVar1;
  uint8_t *local_48;
  ulong local_38;
  size_t i;
  bool_t WithData_local;
  matroska_frame *Frame_local;
  size_t FrameNum_local;
  matroska_block *Block_local;
  
  if ((WithData != 0) && ((Block->Base).Base.bValueIsSet == '\0')) {
    __assert_fail("!WithData || Block->Base.Base.bValueIsSet",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x5ff,
                  "err_t MATROSKA_BlockGetFrame(const matroska_block *, size_t, matroska_frame *, bool_t)"
                 );
  }
  if (WithData != 0) {
    if (Block == (matroska_block *)0xffffffffffffff58) {
      __assert_fail("&(Block->Data)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x600,
                    "err_t MATROSKA_BlockGetFrame(const matroska_block *, size_t, matroska_frame *, bool_t)"
                   );
    }
    if ((Block->Data)._Used == 0) {
      return -0x15;
    }
  }
  if (Block == (matroska_block *)0xffffffffffffff78) {
    __assert_fail("&(Block->SizeList)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                  ,0x602,
                  "err_t MATROSKA_BlockGetFrame(const matroska_block *, size_t, matroska_frame *, bool_t)"
                 );
  }
  if (FrameNum < (Block->SizeList)._Used >> 2) {
    if (WithData == 0) {
      local_48 = (uint8_t *)0x0;
    }
    else {
      if (Block == (matroska_block *)0xffffffffffffff58) {
        __assert_fail("&(Block->Data)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x605,
                      "err_t MATROSKA_BlockGetFrame(const matroska_block *, size_t, matroska_frame *, bool_t)"
                     );
      }
      local_48 = (uint8_t *)(Block->Data)._Begin;
    }
    Frame->Data = local_48;
    mVar1 = MATROSKA_BlockTimestamp(Block);
    Frame->Timestamp = mVar1;
    for (local_38 = 0; local_38 < FrameNum; local_38 = local_38 + 1) {
      if (WithData != 0) {
        if (Block == (matroska_block *)0xffffffffffffff78) {
          __assert_fail("&(Block->SizeList)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x609,
                        "err_t MATROSKA_BlockGetFrame(const matroska_block *, size_t, matroska_frame *, bool_t)"
                       );
        }
        Frame->Data = Frame->Data + *(uint *)((Block->SizeList)._Begin + local_38 * 4);
      }
      if (Frame->Timestamp != 0x7fffffffffffffff) {
        if (Block == (matroska_block *)0xffffffffffffff48) {
          __assert_fail("&(Block->Durations)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                        ,0x60c,
                        "err_t MATROSKA_BlockGetFrame(const matroska_block *, size_t, matroska_frame *, bool_t)"
                       );
        }
        if (local_38 < (Block->Durations)._Used >> 3) {
          if (Block == (matroska_block *)0xffffffffffffff48) {
            __assert_fail("&(Block->Durations)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                          ,0x60c,
                          "err_t MATROSKA_BlockGetFrame(const matroska_block *, size_t, matroska_frame *, bool_t)"
                         );
          }
          if (*(long *)((Block->Durations)._Begin + local_38 * 8) != 0x7fffffffffffffff) {
            if (Block == (matroska_block *)0xffffffffffffff48) {
              __assert_fail("&(Block->Durations)!=NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                            ,0x60d,
                            "err_t MATROSKA_BlockGetFrame(const matroska_block *, size_t, matroska_frame *, bool_t)"
                           );
            }
            Frame->Timestamp =
                 *(long *)((Block->Durations)._Begin + local_38 * 8) + Frame->Timestamp;
            goto LAB_00111199;
          }
        }
        Frame->Timestamp = 0x7fffffffffffffff;
      }
LAB_00111199:
    }
    if (Block == (matroska_block *)0xffffffffffffff78) {
      __assert_fail("&(Block->SizeList)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x613,
                    "err_t MATROSKA_BlockGetFrame(const matroska_block *, size_t, matroska_frame *, bool_t)"
                   );
    }
    Frame->Size = *(uint32_t *)((Block->SizeList)._Begin + local_38 * 4);
    if (Block == (matroska_block *)0xffffffffffffff48) {
      __assert_fail("&(Block->Durations)!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                    ,0x614,
                    "err_t MATROSKA_BlockGetFrame(const matroska_block *, size_t, matroska_frame *, bool_t)"
                   );
    }
    if (FrameNum < (Block->Durations)._Used >> 3) {
      if (Block == (matroska_block *)0xffffffffffffff48) {
        __assert_fail("&(Block->Durations)!=NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskamain.c"
                      ,0x615,
                      "err_t MATROSKA_BlockGetFrame(const matroska_block *, size_t, matroska_frame *, bool_t)"
                     );
      }
      Frame->Duration = *(mkv_timestamp_t *)((Block->Durations)._Begin + local_38 * 8);
    }
    else {
      Frame->Duration = 0x7fffffffffffffff;
    }
    Block_local = (matroska_block *)0x0;
  }
  else {
    Block_local = (matroska_block *)0xfffffffffffffffc;
  }
  return (err_t)Block_local;
}

Assistant:

err_t MATROSKA_BlockGetFrame(const matroska_block *Block, size_t FrameNum, matroska_frame *Frame, bool_t WithData)
{
    size_t i;

    assert(!WithData || Block->Base.Base.bValueIsSet);
    if (WithData && !ARRAYCOUNT(Block->Data,uint8_t))
        return ERR_READ;
    if (FrameNum >= ARRAYCOUNT(Block->SizeList,uint32_t))
        return ERR_INVALID_PARAM;

    Frame->Data = WithData ? ARRAYBEGIN(Block->Data,uint8_t) : NULL;
    Frame->Timestamp = MATROSKA_BlockTimestamp((matroska_block*)Block);
    for (i=0;i<FrameNum;++i)
    {
        if (WithData) Frame->Data += ARRAYBEGIN(Block->SizeList,uint32_t)[i];
        if (Frame->Timestamp != INVALID_TIMESTAMP_T)
        {
            if (i < ARRAYCOUNT(Block->Durations,mkv_timestamp_t) && ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[i] != INVALID_TIMESTAMP_T)
                Frame->Timestamp += ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[i];
            else
                Frame->Timestamp = INVALID_TIMESTAMP_T;
        }
    }

    Frame->Size = ARRAYBEGIN(Block->SizeList,uint32_t)[i];
    if (FrameNum < ARRAYCOUNT(Block->Durations,mkv_timestamp_t))
        Frame->Duration = ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[i];
    else
        Frame->Duration = INVALID_TIMESTAMP_T;
    return ERR_NONE;
}